

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WorkerStream.cpp
# Opt level: O3

void __thiscall WorkerStream::start(WorkerStream *this)

{
  undefined1 *puVar1;
  byte bVar2;
  byte bVar3;
  bool bVar4;
  _Rb_tree_node_base *p_Var5;
  _Self __tmp;
  
  p_Var5 = *(_Rb_tree_node_base **)&this->field_0x18;
  puVar1 = &this->field_0x8;
  if (p_Var5 != (_Rb_tree_node_base *)puVar1) {
    do {
      WorkerFlow::ready((WorkerFlow *)**(undefined8 **)(p_Var5 + 2));
      p_Var5 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var5);
    } while (p_Var5 != (_Rb_tree_node_base *)puVar1);
    p_Var5 = *(_Rb_tree_node_base **)&this->field_0x18;
  }
  if (p_Var5 != (_Rb_tree_node_base *)puVar1) {
    bVar3 = 0;
    do {
      do {
        bVar2 = bVar3;
        if (*(char *)(*(undefined8 **)(p_Var5 + 2) + 1) == '\0') {
          bVar4 = WorkerFlow::work((WorkerFlow *)**(undefined8 **)(p_Var5 + 2));
          bVar2 = 1;
          if (!bVar4) {
            *(undefined1 *)(*(long *)(p_Var5 + 2) + 8) = 1;
            bVar2 = bVar3;
          }
        }
        p_Var5 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var5);
        bVar3 = bVar2;
      } while (p_Var5 != (_Rb_tree_node_base *)puVar1);
      p_Var5 = *(_Rb_tree_node_base **)&this->field_0x18;
      bVar3 = 0;
    } while ((bool)(bVar2 & p_Var5 != (_Rb_tree_node_base *)puVar1));
  }
  return;
}

Assistant:

void WorkerStream::start() 
{
    typedef std::map<std::string, WorkerWrapper*>::iterator it_type;

    // tell each worker that it is ready to begin working.
    for (it_type it = m_flows.begin(); it != m_flows.end(); it++) {
        it->second->flow->ready();
    }

    // this flag will tell us if some flow isn't stopped, and iterate again.
    bool not_done = true;

    while (not_done) {
        not_done = false;

        // loop each flow.
        for (it_type it = m_flows.begin(); it != m_flows.end(); it++) {
            // if the flow is stopped, skip it.
            if (it->second->stopped) {
                continue;
            }

            // if the flow work() returns true, then there's more work to be
            // done.
            if (it->second->flow->work()) {
                // set the flag to true to iterate again.
                not_done = true;
            } else {
                // set this flow as stopped, in order to skip it.
                it->second->stopped = true;
            }
        }
    }
}